

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

void tcu::opt::registerOptions(Parser *parser)

{
  Parser *pPVar1;
  Option<tcu::opt::Validation> local_748;
  Option<tcu::opt::LogFlush> local_710;
  Option<tcu::opt::TestOOM> local_6d8;
  Option<tcu::opt::LogShaderSources> local_6a0;
  Option<tcu::opt::LogImages> local_668;
  Option<tcu::opt::VKDeviceID> local_630;
  Option<tcu::opt::EGLPixmapType> local_5f8;
  Option<tcu::opt::EGLWindowType> local_5c0;
  Option<tcu::opt::EGLDisplayType> local_588;
  Option<tcu::opt::CLBuildOptions> local_550;
  Option<tcu::opt::CLDeviceIDs> local_518;
  Option<tcu::opt::CLPlatformID> local_4e0;
  Option<tcu::opt::GLContextFlags> local_4a8;
  Option<tcu::opt::GLConfigName> local_470;
  Option<tcu::opt::GLConfigID> local_438;
  Option<tcu::opt::GLContextType> local_400;
  Option<tcu::opt::ScreenRotation> local_3c8;
  Option<tcu::opt::SurfaceType> local_390;
  Option<tcu::opt::SurfaceHeight> local_358;
  Option<tcu::opt::SurfaceWidth> local_320;
  Option<tcu::opt::Visibility> local_2e8;
  Option<tcu::opt::TestIterationCount> local_2b0;
  Option<tcu::opt::BaseSeed> local_278;
  Option<tcu::opt::CrashHandler> local_240;
  Option<tcu::opt::WatchDog> local_208;
  Option<tcu::opt::ExportFilenamePattern> local_1d0;
  Option<tcu::opt::RunMode> local_198;
  Option<tcu::opt::LogFilename> local_160;
  Option<tcu::opt::StdinCaseList> local_128;
  Option<tcu::opt::CaseListResource> local_f0;
  Option<tcu::opt::CaseListFile> local_b8;
  Option<tcu::opt::CaseList> local_80;
  Option<tcu::opt::CasePath> local_48;
  Parser *local_10;
  Parser *parser_local;
  
  local_10 = parser;
  de::cmdline::Option<tcu::opt::CasePath>::Option
            (&local_48,"n","deqp-case",
             "Test case(s) to run, supports wildcards (e.g. dEQP-GLES2.info.*)",(char *)0x0);
  pPVar1 = de::cmdline::detail::operator<<(parser,&local_48);
  de::cmdline::Option<tcu::opt::CaseList>::Option
            (&local_80,(char *)0x0,"deqp-caselist",
             "Case list to run in trie format (e.g. {dEQP-GLES2{info{version,renderer}}})",
             (char *)0x0);
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_80);
  de::cmdline::Option<tcu::opt::CaseListFile>::Option
            (&local_b8,(char *)0x0,"deqp-caselist-file",
             "Read case list (in trie format) from given file",(char *)0x0);
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_b8);
  de::cmdline::Option<tcu::opt::CaseListResource>::Option
            (&local_f0,(char *)0x0,"deqp-caselist-resource",
             "Read case list (in trie format) from given file located application\'s assets",
             (char *)0x0);
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_f0);
  de::cmdline::Option<tcu::opt::StdinCaseList>::Option
            (&local_128,(char *)0x0,"deqp-stdin-caselist",
             "Read case list (in trie format) from stdin",(char *)0x0);
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_128);
  de::cmdline::Option<tcu::opt::LogFilename>::Option
            (&local_160,(char *)0x0,"deqp-log-filename","Write test results to given file",
             "TestResults.qpa");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_160);
  de::cmdline::Option<tcu::opt::RunMode>::Option<4ul>
            (&local_198,(char *)0x0,"deqp-runmode",
             "Execute tests, or write list of test cases into a file",&registerOptions::s_runModes,
             "execute");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_198);
  de::cmdline::Option<tcu::opt::ExportFilenamePattern>::Option
            (&local_1d0,(char *)0x0,"deqp-caselist-export-file",
             "Set the target file name pattern for caselist export",
             "${packageName}-cases.${typeExtension}");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_1d0);
  de::cmdline::Option<tcu::opt::WatchDog>::Option<2ul>
            (&local_208,(char *)0x0,"deqp-watchdog","Enable test watchdog",
             &registerOptions::s_enableNames,"disable");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_208);
  de::cmdline::Option<tcu::opt::CrashHandler>::Option<2ul>
            (&local_240,(char *)0x0,"deqp-crashhandler","Enable crash handling",
             &registerOptions::s_enableNames,"disable");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_240);
  de::cmdline::Option<tcu::opt::BaseSeed>::Option
            (&local_278,(char *)0x0,"deqp-base-seed",
             "Base seed for test cases that use randomization","0");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_278);
  de::cmdline::Option<tcu::opt::TestIterationCount>::Option
            (&local_2b0,(char *)0x0,"deqp-test-iteration-count",
             "Iteration count for cases that support variable number of iterations","0");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_2b0);
  de::cmdline::Option<tcu::opt::Visibility>::Option<3ul>
            (&local_2e8,(char *)0x0,"deqp-visibility","Default test window visibility",
             &registerOptions::s_visibilites,"windowed");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_2e8);
  de::cmdline::Option<tcu::opt::SurfaceWidth>::Option
            (&local_320,(char *)0x0,"deqp-surface-width","Use given surface width if possible","-1")
  ;
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_320);
  de::cmdline::Option<tcu::opt::SurfaceHeight>::Option
            (&local_358,(char *)0x0,"deqp-surface-height","Use given surface height if possible",
             "-1");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_358);
  de::cmdline::Option<tcu::opt::SurfaceType>::Option<4ul>
            (&local_390,(char *)0x0,"deqp-surface-type","Use given surface type",
             &registerOptions::s_surfaceTypes,"window");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_390);
  de::cmdline::Option<tcu::opt::ScreenRotation>::Option<5ul>
            (&local_3c8,(char *)0x0,"deqp-screen-rotation",
             "Screen rotation for platforms that support it",&registerOptions::s_screenRotations,"0"
            );
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_3c8);
  de::cmdline::Option<tcu::opt::GLContextType>::Option
            (&local_400,(char *)0x0,"deqp-gl-context-type",
             "OpenGL context type for platforms that support multiple",(char *)0x0);
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_400);
  de::cmdline::Option<tcu::opt::GLConfigID>::Option
            (&local_438,(char *)0x0,"deqp-gl-config-id",
             "OpenGL (ES) render config ID (EGL config id on EGL platforms)","-1");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_438);
  de::cmdline::Option<tcu::opt::GLConfigName>::Option
            (&local_470,(char *)0x0,"deqp-gl-config-name","Symbolic OpenGL (ES) render config name",
             (char *)0x0);
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_470);
  de::cmdline::Option<tcu::opt::GLContextFlags>::Option
            (&local_4a8,(char *)0x0,"deqp-gl-context-flags",
             "OpenGL context flags (comma-separated, supports debug and robust)",(char *)0x0);
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_4a8);
  de::cmdline::Option<tcu::opt::CLPlatformID>::Option
            (&local_4e0,(char *)0x0,"deqp-cl-platform-id",
             "Execute tests on given OpenCL platform (IDs start from 1)","1");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_4e0);
  de::cmdline::Option<tcu::opt::CLDeviceIDs>::Option
            (&local_518,(char *)0x0,"deqp-cl-device-ids",
             "Execute tests on given CL devices (comma-separated, IDs start from 1)",parseIntList,""
            );
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_518);
  de::cmdline::Option<tcu::opt::CLBuildOptions>::Option
            (&local_550,(char *)0x0,"deqp-cl-build-options",
             "Extra build options for OpenCL compiler",(char *)0x0);
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_550);
  de::cmdline::Option<tcu::opt::EGLDisplayType>::Option
            (&local_588,(char *)0x0,"deqp-egl-display-type","EGL native display type",(char *)0x0);
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_588);
  de::cmdline::Option<tcu::opt::EGLWindowType>::Option
            (&local_5c0,(char *)0x0,"deqp-egl-window-type","EGL native window type",(char *)0x0);
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_5c0);
  de::cmdline::Option<tcu::opt::EGLPixmapType>::Option
            (&local_5f8,(char *)0x0,"deqp-egl-pixmap-type","EGL native pixmap type",(char *)0x0);
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_5f8);
  de::cmdline::Option<tcu::opt::VKDeviceID>::Option
            (&local_630,(char *)0x0,"deqp-vk-device-id","Vulkan device ID (IDs start from 1)","1");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_630);
  de::cmdline::Option<tcu::opt::LogImages>::Option<2ul>
            (&local_668,(char *)0x0,"deqp-log-images","Enable or disable logging of result images",
             &registerOptions::s_enableNames,"enable");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_668);
  de::cmdline::Option<tcu::opt::LogShaderSources>::Option<2ul>
            (&local_6a0,(char *)0x0,"deqp-log-shader-sources",
             "Enable or disable logging of shader sources",&registerOptions::s_enableNames,"enable")
  ;
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_6a0);
  de::cmdline::Option<tcu::opt::TestOOM>::Option<2ul>
            (&local_6d8,(char *)0x0,"deqp-test-oom","Run tests that exhaust memory on purpose",
             &registerOptions::s_enableNames,"disable");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_6d8);
  de::cmdline::Option<tcu::opt::LogFlush>::Option<2ul>
            (&local_710,(char *)0x0,"deqp-log-flush","Enable or disable log file fflush",
             &registerOptions::s_enableNames,"enable");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_710);
  de::cmdline::Option<tcu::opt::Validation>::Option<2ul>
            (&local_748,(char *)0x0,"deqp-validation","Enable or disable test case validation",
             &registerOptions::s_enableNames,"disable");
  de::cmdline::detail::operator<<(pPVar1,&local_748);
  return;
}

Assistant:

void registerOptions (de::cmdline::Parser& parser)
{
	using de::cmdline::Option;
	using de::cmdline::NamedValue;

	static const NamedValue<bool> s_enableNames[] =
	{
		{ "enable",		true	},
		{ "disable",	false	}
	};
	static const NamedValue<tcu::RunMode> s_runModes[] =
	{
		{ "execute",		RUNMODE_EXECUTE				},
		{ "xml-caselist",	RUNMODE_DUMP_XML_CASELIST	},
		{ "txt-caselist",	RUNMODE_DUMP_TEXT_CASELIST	},
		{ "stdout-caselist",RUNMODE_DUMP_STDOUT_CASELIST}
	};
	static const NamedValue<WindowVisibility> s_visibilites[] =
	{
		{ "windowed",		WINDOWVISIBILITY_WINDOWED	},
		{ "fullscreen",		WINDOWVISIBILITY_FULLSCREEN	},
		{ "hidden",			WINDOWVISIBILITY_HIDDEN		}
	};
	static const NamedValue<tcu::SurfaceType> s_surfaceTypes[] =
	{
		{ "window",			SURFACETYPE_WINDOW				},
		{ "pixmap",			SURFACETYPE_OFFSCREEN_NATIVE	},
		{ "pbuffer",		SURFACETYPE_OFFSCREEN_GENERIC	},
		{ "fbo",			SURFACETYPE_FBO					}
	};
	static const NamedValue<tcu::ScreenRotation> s_screenRotations[] =
	{
		{ "unspecified",	SCREENROTATION_UNSPECIFIED	},
		{ "0",				SCREENROTATION_0			},
		{ "90",				SCREENROTATION_90			},
		{ "180",			SCREENROTATION_180			},
		{ "270",			SCREENROTATION_270			}
	};

	parser
		<< Option<CasePath>				("n",		"deqp-case",					"Test case(s) to run, supports wildcards (e.g. dEQP-GLES2.info.*)")
		<< Option<CaseList>				(DE_NULL,	"deqp-caselist",				"Case list to run in trie format (e.g. {dEQP-GLES2{info{version,renderer}}})")
		<< Option<CaseListFile>			(DE_NULL,	"deqp-caselist-file",			"Read case list (in trie format) from given file")
		<< Option<CaseListResource>		(DE_NULL,	"deqp-caselist-resource",		"Read case list (in trie format) from given file located application's assets")
		<< Option<StdinCaseList>		(DE_NULL,	"deqp-stdin-caselist",			"Read case list (in trie format) from stdin")
		<< Option<LogFilename>			(DE_NULL,	"deqp-log-filename",			"Write test results to given file",					"TestResults.qpa")
		<< Option<RunMode>				(DE_NULL,	"deqp-runmode",					"Execute tests, or write list of test cases into a file",
																																		s_runModes,			"execute")
		<< Option<ExportFilenamePattern>(DE_NULL,	"deqp-caselist-export-file",	"Set the target file name pattern for caselist export",					"${packageName}-cases.${typeExtension}")
		<< Option<WatchDog>				(DE_NULL,	"deqp-watchdog",				"Enable test watchdog",								s_enableNames,		"disable")
		<< Option<CrashHandler>			(DE_NULL,	"deqp-crashhandler",			"Enable crash handling",							s_enableNames,		"disable")
		<< Option<BaseSeed>				(DE_NULL,	"deqp-base-seed",				"Base seed for test cases that use randomization",						"0")
		<< Option<TestIterationCount>	(DE_NULL,	"deqp-test-iteration-count",	"Iteration count for cases that support variable number of iterations",	"0")
		<< Option<Visibility>			(DE_NULL,	"deqp-visibility",				"Default test window visibility",					s_visibilites,		"windowed")
		<< Option<SurfaceWidth>			(DE_NULL,	"deqp-surface-width",			"Use given surface width if possible",									"-1")
		<< Option<SurfaceHeight>		(DE_NULL,	"deqp-surface-height",			"Use given surface height if possible",									"-1")
		<< Option<SurfaceType>			(DE_NULL,	"deqp-surface-type",			"Use given surface type",							s_surfaceTypes,		"window")
		<< Option<ScreenRotation>		(DE_NULL,	"deqp-screen-rotation",			"Screen rotation for platforms that support it",	s_screenRotations,	"0")
		<< Option<GLContextType>		(DE_NULL,	"deqp-gl-context-type",			"OpenGL context type for platforms that support multiple")
		<< Option<GLConfigID>			(DE_NULL,	"deqp-gl-config-id",			"OpenGL (ES) render config ID (EGL config id on EGL platforms)",		"-1")
		<< Option<GLConfigName>			(DE_NULL,	"deqp-gl-config-name",			"Symbolic OpenGL (ES) render config name")
		<< Option<GLContextFlags>		(DE_NULL,	"deqp-gl-context-flags",		"OpenGL context flags (comma-separated, supports debug and robust)")
		<< Option<CLPlatformID>			(DE_NULL,	"deqp-cl-platform-id",			"Execute tests on given OpenCL platform (IDs start from 1)",			"1")
		<< Option<CLDeviceIDs>			(DE_NULL,	"deqp-cl-device-ids",			"Execute tests on given CL devices (comma-separated, IDs start from 1)",	parseIntList,	"")
		<< Option<CLBuildOptions>		(DE_NULL,	"deqp-cl-build-options",		"Extra build options for OpenCL compiler")
		<< Option<EGLDisplayType>		(DE_NULL,	"deqp-egl-display-type",		"EGL native display type")
		<< Option<EGLWindowType>		(DE_NULL,	"deqp-egl-window-type",			"EGL native window type")
		<< Option<EGLPixmapType>		(DE_NULL,	"deqp-egl-pixmap-type",			"EGL native pixmap type")
		<< Option<VKDeviceID>			(DE_NULL,	"deqp-vk-device-id",			"Vulkan device ID (IDs start from 1)",									"1")
		<< Option<LogImages>			(DE_NULL,	"deqp-log-images",				"Enable or disable logging of result images",		s_enableNames,		"enable")
		<< Option<LogShaderSources>		(DE_NULL,	"deqp-log-shader-sources",		"Enable or disable logging of shader sources",		s_enableNames,		"enable")
		<< Option<TestOOM>				(DE_NULL,	"deqp-test-oom",				"Run tests that exhaust memory on purpose",			s_enableNames,		TEST_OOM_DEFAULT)
		<< Option<LogFlush>				(DE_NULL,	"deqp-log-flush",				"Enable or disable log file fflush",				s_enableNames,		"enable")
		<< Option<Validation>			(DE_NULL,	"deqp-validation",				"Enable or disable test case validation",			s_enableNames,		"disable");
}